

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMesh::KRMmatricesLoad(ChMesh *this,double Kfactor,double Rfactor,double Mfactor)

{
  pointer psVar1;
  rep_conflict rVar2;
  int ie;
  ulong uVar3;
  long lVar4;
  
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->timer_KRMload).m_start.__d.__r = rVar2;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    psVar1 = (this->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->velements).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar3)
    break;
    (**(code **)(**(long **)((long)&(psVar1->
                                    super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar4) + 0x90))(Kfactor,Rfactor,Mfactor);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  ChTimer<double>::stop(&this->timer_KRMload);
  this->ncalls_KRMload = this->ncalls_KRMload + 1;
  return;
}

Assistant:

void ChMesh::KRMmatricesLoad(double Kfactor, double Rfactor, double Mfactor) {
    int nthreads = GetSystem()->nthreads_chrono;

    timer_KRMload.start();
#pragma omp parallel for num_threads(nthreads)
    for (int ie = 0; ie < velements.size(); ie++)
        velements[ie]->KRMmatricesLoad(Kfactor, Rfactor, Mfactor);
    timer_KRMload.stop();
    ncalls_KRMload++;
}